

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O3

int Vec_QuePop(Vec_Que_t *p)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  float *pfVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if (p->nSize < 2) {
    __assert_fail("p->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                  ,0xed,"int Vec_QuePop(Vec_Que_t *)");
  }
  piVar3 = p->pHeap;
  piVar4 = p->pOrder;
  iVar1 = piVar3[1];
  piVar4[iVar1] = -1;
  iVar9 = p->nSize;
  p->nSize = iVar9 + -1;
  if (iVar9 + -1 == 1) {
    piVar3[1] = -1;
  }
  else {
    iVar2 = piVar3[(long)iVar9 + -1];
    piVar3[(long)iVar9 + -1] = -1;
    piVar3[1] = iVar2;
    piVar4[iVar2] = 1;
    pfVar5 = *p->pCostsFlt;
    if (pfVar5 == (float *)0x0) {
      fVar11 = (float)iVar2;
    }
    else {
      fVar11 = pfVar5[iVar2];
    }
    iVar9 = p->nSize;
    uVar7 = 1;
    if (2 < iVar9) {
      uVar8 = 2;
      uVar7 = 1;
      do {
        uVar10 = uVar8 | 1;
        uVar6 = uVar8;
        if ((int)uVar10 < iVar9) {
          if (pfVar5 == (float *)0x0) {
            fVar12 = (float)piVar3[(int)uVar8];
            fVar13 = (float)piVar3[(int)uVar10];
          }
          else {
            fVar12 = pfVar5[piVar3[(int)uVar8]];
            fVar13 = pfVar5[piVar3[(int)uVar10]];
          }
          if (fVar12 < fVar13) {
            uVar6 = uVar10;
          }
        }
        if (iVar9 <= (int)uVar6) {
          __assert_fail("child < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                        ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
        }
        iVar9 = piVar3[(int)uVar6];
        if (pfVar5 == (float *)0x0) {
          fVar12 = (float)iVar9;
        }
        else {
          fVar12 = pfVar5[iVar9];
        }
        if (fVar12 <= fVar11) break;
        piVar3[(int)uVar7] = iVar9;
        piVar4[iVar9] = uVar7;
        uVar8 = uVar6 * 2;
        iVar9 = p->nSize;
        uVar7 = uVar6;
      } while ((int)uVar8 < iVar9);
    }
    piVar3[(int)uVar7] = iVar2;
    piVar4[iVar2] = uVar7;
  }
  return iVar1;
}

Assistant:

static inline int Vec_QuePop( Vec_Que_t * p )
{
    int v, Res;
    assert( p->nSize > 1 );
    Res = p->pHeap[1];      p->pOrder[Res] = -1;
    if ( --p->nSize == 1 )
    {
        p->pHeap[1] = -1;
        return Res;
    }
    v = p->pHeap[p->nSize]; p->pHeap[p->nSize] = -1;
    p->pHeap[1] = v;        p->pOrder[v] = 1;
    Vec_QueMoveDown( p, v );
    return Res;
}